

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

ImVector_ImVec2 * ImVector_ImVec2_ImVector_ImVec2Vector(ImVector_ImVec2 *src)

{
  ImVector<ImVec2> *this;
  
  this = (ImVector<ImVec2> *)ImGui::MemAlloc(0x10);
  ImVector<ImVec2>::ImVector(this,src);
  return this;
}

Assistant:

CIMGUI_API ImVector_ImVec2* ImVector_ImVec2_ImVector_ImVec2Vector(const ImVector_ImVec2 src)
{
    return IM_NEW(ImVector_ImVec2)(src);
}